

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

photonstream * __thiscall
NEST::NESTcalc::GetPhotonTimes
          (photonstream *__return_storage_ptr__,NESTcalc *this,INTERACTION_TYPE species,
          int total_photons,int excitons,double dfield,double energy)

{
  runtime_error *this_00;
  double local_68;
  undefined1 local_59;
  int local_58;
  bool isExciton;
  int ip;
  int excit;
  int total;
  double energy_local;
  double dfield_local;
  int local_20;
  int excitons_local;
  int total_photons_local;
  INTERACTION_TYPE species_local;
  NESTcalc *this_local;
  photonstream *return_photons;
  
  excit._3_1_ = 0;
  _total = energy;
  energy_local = dfield;
  dfield_local._4_4_ = excitons;
  local_20 = total_photons;
  excitons_local = species;
  _total_photons_local = this;
  this_local = (NESTcalc *)__return_storage_ptr__;
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  if (dfield_local._4_4_ <= local_20) {
    for (local_58 = 0; local_58 < local_20; local_58 = local_58 + 1) {
      local_59 = local_58 < dfield_local._4_4_;
      local_68 = PhotonTime(this,excitons_local,(bool)local_59,energy_local,_total);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (__return_storage_ptr__,&local_68);
    }
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "You specified more excitons than total photon numbers?! This is physically wrong and please check your inputs."
            );
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

photonstream NESTcalc::GetPhotonTimes(INTERACTION_TYPE species,
                                      int total_photons, int excitons,
                                      double dfield, double energy) {
  photonstream return_photons;
  int total, excit;
	
  if (excitons > total_photons) {
    throw std::runtime_error("You specified more excitons than total photon numbers?! This is physically wrong and please check your inputs.");
  }
	
  for (int ip = 0; ip < total_photons; ++ip) {
    bool isExciton = false;
    if (ip < excitons) isExciton = true;
    // message from Matthew: please stop telling me next line bad. I can't skip
    // PhotonTime, it's a func not array
    return_photons.emplace_back(PhotonTime(species, isExciton, dfield, energy));
  }

  return return_photons;
}